

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::TestPackedTypes::ByteSizeLong(TestPackedTypes *this)

{
  int iVar1;
  RepeatedField<int> *pRVar2;
  size_t sVar3;
  RepeatedField<long> *pRVar4;
  size_t sVar5;
  RepeatedField<unsigned_int> *value;
  size_t sVar6;
  RepeatedField<unsigned_long> *value_00;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  size_t sVar17;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  size_t tag_size_6;
  size_t data_size_6;
  size_t tag_size_5;
  size_t data_size_5;
  size_t tag_size_4;
  size_t data_size_4;
  size_t tag_size_3;
  size_t data_size_3;
  size_t tag_size_2;
  size_t data_size_2;
  size_t tag_size_1;
  size_t data_size_1;
  size_t tag_size;
  size_t data_size;
  uint32_t cached_has_bits;
  size_t total_size;
  TestPackedTypes *this_;
  TestPackedTypes *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar2 = _internal_packed_int32(this);
  sVar3 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (pRVar2,2,&(this->field_0)._impl_._packed_int32_cached_byte_size_);
  pRVar4 = _internal_packed_int64(this);
  sVar5 = google::protobuf::internal::WireFormatLite::Int64SizeWithPackedTagSize
                    (pRVar4,2,&(this->field_0)._impl_._packed_int64_cached_byte_size_);
  value = _internal_packed_uint32(this);
  sVar6 = google::protobuf::internal::WireFormatLite::UInt32SizeWithPackedTagSize
                    (value,2,&(this->field_0)._impl_._packed_uint32_cached_byte_size_);
  value_00 = _internal_packed_uint64(this);
  sVar7 = google::protobuf::internal::WireFormatLite::UInt64SizeWithPackedTagSize
                    (value_00,2,&(this->field_0)._impl_._packed_uint64_cached_byte_size_);
  pRVar2 = _internal_packed_sint32(this);
  sVar8 = google::protobuf::internal::WireFormatLite::SInt32SizeWithPackedTagSize
                    (pRVar2,2,&(this->field_0)._impl_._packed_sint32_cached_byte_size_);
  pRVar4 = _internal_packed_sint64(this);
  sVar9 = google::protobuf::internal::WireFormatLite::SInt64SizeWithPackedTagSize
                    (pRVar4,2,&(this->field_0)._impl_._packed_sint64_cached_byte_size_);
  iVar1 = _internal_packed_fixed32_size(this);
  sVar10 = google::protobuf::internal::FromIntSize(iVar1);
  lVar11 = sVar10 * 4;
  if (lVar11 == 0) {
    local_d8 = 0;
  }
  else {
    sVar10 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar11);
    local_d8 = sVar10 + 2;
  }
  iVar1 = _internal_packed_fixed64_size(this);
  sVar10 = google::protobuf::internal::FromIntSize(iVar1);
  lVar12 = sVar10 * 8;
  if (lVar12 == 0) {
    local_e0 = 0;
  }
  else {
    sVar10 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar12);
    local_e0 = sVar10 + 2;
  }
  iVar1 = _internal_packed_sfixed32_size(this);
  sVar10 = google::protobuf::internal::FromIntSize(iVar1);
  lVar13 = sVar10 * 4;
  if (lVar13 == 0) {
    local_e8 = 0;
  }
  else {
    sVar10 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar13);
    local_e8 = sVar10 + 2;
  }
  iVar1 = _internal_packed_sfixed64_size(this);
  sVar10 = google::protobuf::internal::FromIntSize(iVar1);
  lVar14 = sVar10 * 8;
  if (lVar14 == 0) {
    local_f0 = 0;
  }
  else {
    sVar10 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar14);
    local_f0 = sVar10 + 2;
  }
  iVar1 = _internal_packed_float_size(this);
  sVar10 = google::protobuf::internal::FromIntSize(iVar1);
  lVar15 = sVar10 * 4;
  if (lVar15 == 0) {
    local_f8 = 0;
  }
  else {
    sVar10 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar15);
    local_f8 = sVar10 + 2;
  }
  iVar1 = _internal_packed_double_size(this);
  sVar10 = google::protobuf::internal::FromIntSize(iVar1);
  lVar16 = sVar10 * 8;
  if (lVar16 == 0) {
    local_100 = 0;
  }
  else {
    sVar10 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar16);
    local_100 = sVar10 + 2;
  }
  iVar1 = _internal_packed_bool_size(this);
  sVar10 = google::protobuf::internal::FromIntSize(iVar1);
  if (sVar10 == 0) {
    local_108 = 0;
  }
  else {
    sVar17 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)sVar10);
    local_108 = sVar17 + 2;
  }
  pRVar2 = _internal_packed_enum(this);
  sVar17 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (pRVar2,2,&(this->field_0)._impl_._packed_enum_cached_byte_size_);
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,
                     sVar17 + local_108 + sVar10 +
                              local_100 + lVar16 +
                              local_f8 + lVar15 +
                              local_f0 + lVar14 +
                              local_e8 + lVar13 +
                              local_e0 + lVar12 +
                              local_d8 + lVar11 + sVar9 + sVar8 + sVar7 + sVar6 + sVar5 + sVar3,
                     &(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestPackedTypes::ByteSizeLong() const {
  const TestPackedTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestPackedTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 packed_int32 = 90 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_packed_int32(), 2,
              this_._impl_._packed_int32_cached_byte_size_);
    }
    // repeated int64 packed_int64 = 91 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::Int64SizeWithPackedTagSize(
              this_._internal_packed_int64(), 2,
              this_._impl_._packed_int64_cached_byte_size_);
    }
    // repeated uint32 packed_uint32 = 92 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt32SizeWithPackedTagSize(
              this_._internal_packed_uint32(), 2,
              this_._impl_._packed_uint32_cached_byte_size_);
    }
    // repeated uint64 packed_uint64 = 93 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt64SizeWithPackedTagSize(
              this_._internal_packed_uint64(), 2,
              this_._impl_._packed_uint64_cached_byte_size_);
    }
    // repeated sint32 packed_sint32 = 94 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::SInt32SizeWithPackedTagSize(
              this_._internal_packed_sint32(), 2,
              this_._impl_._packed_sint32_cached_byte_size_);
    }
    // repeated sint64 packed_sint64 = 95 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::SInt64SizeWithPackedTagSize(
              this_._internal_packed_sint64(), 2,
              this_._impl_._packed_sint64_cached_byte_size_);
    }
    // repeated fixed32 packed_fixed32 = 96 [features = {
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_packed_fixed32_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated fixed64 packed_fixed64 = 97 [features = {
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_packed_fixed64_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated sfixed32 packed_sfixed32 = 98 [features = {
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_packed_sfixed32_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated sfixed64 packed_sfixed64 = 99 [features = {
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_packed_sfixed64_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated float packed_float = 100 [features = {
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_packed_float_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated double packed_double = 101 [features = {
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_packed_double_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool packed_bool = 102 [features = {
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_packed_bool_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated .proto2_unittest.ForeignEnum packed_enum = 103 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_packed_enum(), 2, this_._impl_._packed_enum_cached_byte_size_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}